

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O1

bool __thiscall
cmListCommand::HandleTransformCommand
          (cmListCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  ulong uVar1;
  pointer pbVar2;
  pointer pcVar3;
  cmMakefile *pcVar4;
  TransformAction TVar5;
  pointer __n;
  size_type sVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  code *pcVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  char cVar12;
  int iVar13;
  _Link_type p_Var14;
  _Link_type p_Var15;
  ostream *poVar16;
  _Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false> _Var17;
  long lVar18;
  int *piVar19;
  _Base_ptr p_Var20;
  _Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false> _Var21;
  undefined8 uVar22;
  runtime_error *prVar23;
  ActionDescriptor *__args;
  ActionDescriptor *__args_00;
  _Link_type p_Var24;
  ulong uVar25;
  pointer pbVar26;
  long lVar27;
  _Link_type p_Var28;
  ulong uVar29;
  _Link_type p_Var30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  string REGEX;
  string AT;
  set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
  descriptors;
  ostringstream error;
  Command command;
  string FOR;
  string OUTPUT_VARIABLE;
  int value;
  _Link_type local_5c0;
  undefined1 local_5a8 [32];
  _Link_type local_588;
  string local_580;
  _Base_ptr local_560;
  int local_554;
  long *local_550;
  pointer local_548;
  long local_540 [2];
  undefined1 *local_530;
  undefined8 local_528;
  undefined1 local_520;
  undefined7 uStack_51f;
  undefined8 uStack_518;
  undefined1 *local_510;
  undefined8 local_508;
  undefined1 local_500;
  undefined7 uStack_4ff;
  undefined8 uStack_4f8;
  _Any_data local_4f0;
  long local_4e0;
  code *local_4d8;
  undefined1 local_4d0 [40];
  _Any_data local_4a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  undefined4 local_488;
  Command *local_480;
  undefined8 uStack_478;
  code *local_470;
  code *pcStack_468;
  _Base_ptr local_460;
  _Base_ptr local_458;
  undefined1 local_450 [24];
  Command *local_438;
  undefined8 uStack_430;
  code *local_428;
  code *local_420;
  _Rb_tree_node_base *local_418;
  _Base_ptr local_410;
  _Rb_tree_node_base local_408;
  undefined8 uStack_3e8;
  code *local_3e0;
  code *local_3d8;
  undefined1 *local_3d0;
  undefined8 local_3c8;
  undefined1 local_3c0 [16];
  undefined4 local_3b0;
  Command *local_3a8;
  undefined8 uStack_3a0;
  code *local_398;
  code *local_390;
  undefined1 *local_388;
  undefined8 local_380;
  undefined1 local_378 [8];
  undefined8 uStack_370;
  undefined4 local_368;
  Command *local_360;
  undefined8 uStack_358;
  code *local_350;
  code *local_348;
  _Rb_tree_node_base *local_340;
  _Base_ptr local_338;
  _Rb_tree_node_base local_330;
  undefined8 uStack_310;
  code *local_308;
  code *local_300;
  _Link_type local_2f8 [2];
  undefined1 local_2e8 [40];
  code *local_2c0 [2];
  undefined1 local_2b0 [32];
  string local_290;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  _Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false> _Stack_258;
  _Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false> local_250;
  string local_248;
  _Link_type local_228;
  _Link_type local_220;
  undefined1 local_218 [16];
  _Rb_tree_node_base *local_208;
  _Base_ptr local_200;
  undefined1 local_1f8 [16];
  _Rb_tree_node_base *local_1e8;
  _Base_ptr local_1e0;
  undefined1 local_1d8 [16];
  _Base_ptr local_1c8;
  _Base_ptr local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a8;
  _Base_ptr local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  long *local_188;
  pointer local_180;
  long local_178 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  size_t local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  long local_138 [2];
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_128;
  Command *local_118;
  undefined8 uStack_110;
  code *local_108;
  undefined8 uStack_100;
  Command *local_f8;
  undefined8 uStack_f0;
  code *local_e8;
  undefined8 uStack_e0;
  Command *local_d8;
  undefined8 uStack_d0;
  code *local_c8;
  undefined8 uStack_c0;
  Command *local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  undefined8 uStack_a0;
  Command *local_98;
  undefined8 uStack_90;
  code *local_88;
  undefined8 uStack_80;
  Command *local_78;
  undefined8 uStack_70;
  code *local_68;
  undefined8 uStack_60;
  Command *local_58;
  undefined8 uStack_50;
  code *local_48;
  undefined8 uStack_40;
  
  pbVar26 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar26) < 0x41) {
    local_4a8._M_unused._M_object = &local_498;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4a8,"sub-command TRANSFORM requires an action to be specified.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)&local_4a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_unused._0_8_ != &local_498) {
      operator_delete(local_4a8._M_unused._M_object,
                      CONCAT26(local_498._M_allocated_capacity._6_2_,
                               CONCAT15(local_498._M_local_buf[5],
                                        CONCAT14(local_498._M_local_buf[4],
                                                 CONCAT13(local_498._M_local_buf[3],
                                                          CONCAT12(local_498._M_local_buf[2],
                                                                   CONCAT11(local_498._M_local_buf
                                                                            [1],local_498.
                                                                                _M_local_buf[0])))))
                              ) + 1);
    }
    return false;
  }
  local_2b0._0_8_ = &(((Command *)local_2b0)->Name).field_2;
  local_2b0._8_8_ = 0;
  local_2b0[0x10] = '\0';
  local_290._M_dataplus._M_p = (pointer)&(((Command *)local_2b0)->ListName).field_2;
  pcVar3 = pbVar26[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&((Command *)local_2b0)->ListName,pcVar3,pcVar3 + pbVar26[1]._M_string_length
            );
  local_248._M_dataplus._M_p = (pointer)&(((Command *)local_2b0)->OutputName).field_2;
  local_270.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Stack_258._M_head_impl = (TransformAction *)0x0;
  local_270.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_270.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_250._M_head_impl = (TransformSelector *)0x0;
  pcVar3 = pbVar26[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&((Command *)local_2b0)->OutputName,pcVar3,
             pcVar3 + pbVar26[1]._M_string_length);
  local_4a8._M_unused._M_object = (pointer)0x0;
  local_4a8._8_8_ = 0;
  local_498._8_3_ = 0x1c5318;
  local_498._11_2_ = 0;
  local_498._13_2_ = 0;
  local_498._M_local_buf[0xf] = '\0';
  local_498._M_local_buf[0] = '2';
  local_498._M_local_buf[1] = 'S';
  local_498._M_local_buf[2] = '\x1c';
  local_498._M_local_buf[3] = '\0';
  local_498._M_local_buf[4] = '\0';
  local_498._M_local_buf[5] = '\0';
  local_498._M_allocated_capacity._6_2_ = 0;
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_4f0,
             (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_4a8);
  local_4d0._16_8_ = local_4d0;
  local_4d0._0_4_ = _S_red;
  local_4d0._8_8_ = (_Base_ptr)0x0;
  local_4d0[0x20] = '\0';
  local_4d0[0x21] = '\0';
  local_4d0[0x22] = '\0';
  local_4d0[0x23] = '\0';
  local_4d0[0x24] = '\0';
  local_4d0[0x25] = '\0';
  local_4d0[0x26] = '\0';
  local_4d0[0x27] = '\0';
  pcVar8 = (code *)CONCAT26(local_498._M_allocated_capacity._6_2_,
                            CONCAT15(local_498._M_local_buf[5],
                                     CONCAT14(local_498._M_local_buf[4],
                                              CONCAT13(local_498._M_local_buf[3],
                                                       CONCAT12(local_498._M_local_buf[2],
                                                                CONCAT11(local_498._M_local_buf[1],
                                                                         local_498._M_local_buf[0]))
                                                      ))));
  local_4d0._24_8_ = local_4d0._16_8_;
  if (pcVar8 != (code *)0x0) {
    (*pcVar8)(&local_4a8,&local_4a8,3);
  }
  local_1a8 = &local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"APPEND","");
  uStack_50 = 0;
  local_4a8._M_unused._M_object = &local_498;
  local_498._M_allocated_capacity._6_2_ = (undefined2)((uint7)local_198._1_7_ >> 0x28);
  local_498._M_local_buf[1] = (char)local_198._M_allocated_capacity._1_7_;
  local_498._M_local_buf[2] = (char)((uint7)local_198._1_7_ >> 8);
  local_498._M_local_buf[3] = (char)((uint7)local_198._1_7_ >> 0x10);
  local_498._M_local_buf[4] = (char)((uint7)local_198._1_7_ >> 0x18);
  local_498._M_local_buf[5] = (char)((uint7)local_198._1_7_ >> 0x20);
  if (local_1a8 == &local_198) {
    local_498._8_3_ = (undefined3)local_198._8_8_;
    local_498._11_2_ = (undefined2)((ulong)local_198._8_8_ >> 0x18);
    local_498._13_2_ = (undefined2)((ulong)local_198._8_8_ >> 0x28);
    local_498._M_local_buf[0xf] = (char)((ulong)local_198._8_8_ >> 0x38);
  }
  else {
    local_4a8._M_unused._M_object = local_1a8;
  }
  local_4a8._8_8_ = local_1a0;
  local_1a0 = (_Base_ptr)0x0;
  local_198._M_local_buf[0] = '\0';
  local_488 = 1;
  pcStack_468 = std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmListCommand.cxx:822:21)>
                ::_M_invoke;
  uStack_478 = 0;
  local_470 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmListCommand.cxx:822:21)>
              ::_M_manager;
  local_48 = (code *)0x0;
  uStack_40 = 0;
  local_480 = (Command *)local_2b0;
  local_1c8 = (_Base_ptr)local_1b8;
  local_1a8 = &local_198;
  local_58 = (Command *)local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"PREPEND","");
  uStack_70 = 0;
  local_460 = (_Base_ptr)local_450;
  if (local_1c8 == (_Base_ptr)local_1b8) {
    local_450._8_8_ = local_1b8._8_8_;
  }
  else {
    local_460 = local_1c8;
  }
  local_458 = local_1c0;
  local_1c0 = (_Base_ptr)0x0;
  local_1b8[0] = _S_red;
  local_450._16_4_ = 1;
  local_420 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmListCommand.cxx:830:21)>
              ::_M_invoke;
  uStack_430 = 0;
  local_428 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmListCommand.cxx:830:21)>
              ::_M_manager;
  local_68 = (code *)0x0;
  uStack_60 = 0;
  local_438 = (Command *)local_2b0;
  local_1e8 = (_Rb_tree_node_base *)local_1d8;
  local_1c8 = (_Base_ptr)local_1b8;
  local_78 = (Command *)local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"TOUPPER","");
  uStack_90 = 0;
  local_418 = &local_408;
  if (local_1e8 == (_Rb_tree_node_base *)local_1d8) {
    local_408._M_parent = (_Base_ptr)local_1d8._8_8_;
  }
  else {
    local_418 = local_1e8;
  }
  local_410 = local_1e0;
  local_1e0 = (_Base_ptr)0x0;
  local_1d8[0] = _S_red;
  local_408._M_left._0_4_ = 0;
  local_3d8 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmListCommand.cxx:838:21)>
              ::_M_invoke;
  uStack_3e8 = 0;
  local_3e0 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmListCommand.cxx:838:21)>
              ::_M_manager;
  local_88 = (code *)0x0;
  uStack_80 = 0;
  local_510 = &local_500;
  local_408._M_right = (_Base_ptr)local_2b0;
  local_1e8 = (_Rb_tree_node_base *)local_1d8;
  local_98 = (Command *)local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"TOLOWER","");
  uStack_b0 = 0;
  local_3d0 = local_3c0;
  if (local_510 == &local_500) {
    local_3c0._8_8_ = uStack_4f8;
  }
  else {
    local_3d0 = local_510;
  }
  local_3c8 = local_508;
  local_508 = 0;
  local_500 = 0;
  local_3b0 = 0;
  local_390 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmListCommand.cxx:846:21)>
              ::_M_invoke;
  uStack_3a0 = 0;
  local_398 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmListCommand.cxx:846:21)>
              ::_M_manager;
  local_a8 = (code *)0x0;
  uStack_a0 = 0;
  local_530 = &local_520;
  local_510 = &local_500;
  local_3a8 = (Command *)local_2b0;
  local_b8 = (Command *)local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"STRIP","");
  uStack_d0 = 0;
  local_388 = local_378;
  if (local_530 == &local_520) {
    uStack_370 = uStack_518;
  }
  else {
    local_388 = local_530;
  }
  local_380 = local_528;
  local_528 = 0;
  local_520 = 0;
  local_368 = 0;
  local_348 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmListCommand.cxx:854:21)>
              ::_M_invoke;
  uStack_358 = 0;
  local_350 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmListCommand.cxx:854:21)>
              ::_M_manager;
  local_c8 = (code *)0x0;
  uStack_c0 = 0;
  local_530 = &local_520;
  local_360 = (Command *)local_2b0;
  local_208 = (_Rb_tree_node_base *)local_1f8;
  local_d8 = (Command *)local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"GENEX_STRIP","");
  uStack_f0 = 0;
  local_340 = &local_330;
  if (local_208 == (_Rb_tree_node_base *)local_1f8) {
    local_330._M_parent = (_Base_ptr)local_1f8._8_8_;
  }
  else {
    local_340 = local_208;
  }
  local_338 = local_200;
  local_200 = (_Base_ptr)0x0;
  local_1f8[0] = _S_red;
  local_330._M_left._0_4_ = 0;
  local_300 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmListCommand.cxx:862:21)>
              ::_M_invoke;
  uStack_310 = 0;
  local_308 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmListCommand.cxx:862:21)>
              ::_M_manager;
  local_e8 = (code *)0x0;
  uStack_e0 = 0;
  local_330._M_right = (_Base_ptr)local_2b0;
  local_228 = (_Link_type)local_218;
  local_208 = (_Rb_tree_node_base *)local_1f8;
  local_f8 = (Command *)local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"REPLACE","");
  p_Var15 = local_220;
  uStack_110 = 0;
  local_2f8[0] = (_Link_type)local_2e8;
  if (local_228 == (_Link_type)local_218) {
    local_2e8._8_8_ = local_218._8_8_;
  }
  else {
    local_2f8[0] = local_228;
  }
  local_2f8[1] = local_220;
  local_220 = (_Link_type)0x0;
  local_218[0] = _S_red;
  local_2e8._16_4_ = 2;
  local_2c0[1] = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmListCommand.cxx:872:21)>
                 ::_M_invoke;
  local_2e8._32_8_ = 0;
  local_2c0[0] = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmListCommand.cxx:872:21)>
                 ::_M_manager;
  local_108 = (code *)0x0;
  uStack_100 = 0;
  local_560 = (_Base_ptr)local_4d0._8_8_;
  if ((_Base_ptr)local_4d0._8_8_ == (_Base_ptr)0x0) {
    local_5c0 = (_Link_type)0x0;
  }
  else {
    *(_Base_ptr *)(local_4d0._8_8_ + 8) = (_Base_ptr)0x0;
    local_5c0 = (_Link_type)((_Rb_tree_node_base *)local_4d0._24_8_)->_M_left;
    if (local_5c0 == (_Link_type)0x0) {
      local_5c0 = (_Link_type)local_4d0._24_8_;
    }
  }
  local_4d0._8_8_ = (_Link_type)0x0;
  local_4d0._16_8_ = local_4d0;
  local_4d0._32_8_ = 0;
  lVar27 = 0;
  local_4d0._24_8_ = local_4d0._16_8_;
  local_2e8._24_8_ = (Command *)local_2b0;
  local_228 = (_Link_type)local_218;
  local_118 = (Command *)local_2b0;
  do {
    p_Var28 = (_Link_type)((long)&local_4a8 + lVar27);
    if (local_4d0._32_8_ == 0) {
LAB_001c0773:
      p_Var30 = (_Link_type)local_4d0._8_8_;
      if ((_Link_type)local_4d0._8_8_ == (_Link_type)0x0) {
        bVar10 = true;
        p_Var24 = (_Link_type)local_4d0;
      }
      else {
        do {
          p_Var24 = p_Var30;
          if (local_4e0 == 0) goto LAB_001c2010;
          p_Var15 = p_Var28;
          bVar10 = (*local_4d8)(&local_4f0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )p_Var28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&p_Var24->_M_storage);
          p_Var30 = *(_Link_type *)((p_Var24->_M_storage)._M_storage + (ulong)!bVar10 * 8 + -0x10);
        } while (p_Var30 != (_Link_type)0x0);
      }
      p_Var14 = p_Var24;
      if (bVar10 == false) {
LAB_001c07dd:
        if (local_4e0 == 0) {
LAB_001c2010:
          std::__throw_bad_function_call();
        }
        p_Var15 = (_Link_type)&p_Var14->_M_storage;
        bVar10 = (*local_4d8)(&local_4f0,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              p_Var15,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)p_Var28);
        if (!bVar10) {
          p_Var24 = (_Link_type)0x0;
          p_Var30 = p_Var14;
        }
      }
      else if (p_Var24 != (_Link_type)local_4d0._16_8_) {
        p_Var14 = (_Link_type)std::_Rb_tree_decrement(&p_Var24->super__Rb_tree_node_base);
        goto LAB_001c07dd;
      }
      bVar10 = p_Var30 != (_Link_type)0x0;
    }
    else {
      if (local_4e0 == 0) goto LAB_001c2025;
      p_Var15 = (_Link_type)(local_4d0._24_8_ + 0x20);
      bVar10 = (*local_4d8)(&local_4f0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            p_Var15,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)p_Var28);
      if (!bVar10) goto LAB_001c0773;
      bVar10 = false;
      p_Var24 = (_Link_type)local_4d0._24_8_;
    }
    if (p_Var24 != (_Link_type)0x0) {
      bVar11 = true;
      if (!bVar10 && (_Link_type)local_4d0 != p_Var24) {
        if (local_4e0 == 0) {
LAB_001c2025:
          std::__throw_bad_function_call();
        }
        p_Var15 = p_Var28;
        bVar11 = (*local_4d8)(&local_4f0,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              p_Var28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&p_Var24->_M_storage);
      }
      if (local_5c0 == (_Link_type)0x0) {
        local_588 = local_5c0;
        local_5c0 = (_Link_type)0x0;
      }
      else {
        local_588 = (_Link_type)(local_5c0->super__Rb_tree_node_base)._M_parent;
        if (local_588 == (_Link_type)0x0) {
          local_560 = (_Base_ptr)0x0;
        }
        else if ((_Link_type)(local_588->super__Rb_tree_node_base)._M_right == local_5c0) {
          (local_588->super__Rb_tree_node_base)._M_right = (_Base_ptr)0x0;
          p_Var30 = (_Link_type)(local_588->super__Rb_tree_node_base)._M_left;
          if (p_Var30 != (_Link_type)0x0) {
            do {
              p_Var14 = p_Var30;
              p_Var30 = (_Link_type)(p_Var14->super__Rb_tree_node_base)._M_right;
            } while (p_Var30 != (_Link_type)0x0);
            local_588 = (_Link_type)(p_Var14->super__Rb_tree_node_base)._M_left;
            if (local_588 == (_Link_type)0x0) {
              local_588 = p_Var14;
            }
          }
        }
        else {
          (local_588->super__Rb_tree_node_base)._M_left = (_Base_ptr)0x0;
        }
      }
      if (local_5c0 == (_Link_type)0x0) {
        p_Var15 = (_Link_type)operator_new(0x68);
        std::
        _Rb_tree<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor,cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor,std::_Identity<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor>,std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>,std::allocator<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor>>
        ::
        _M_construct_node<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor_const&>
                  ((_Rb_tree<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor,cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor,std::_Identity<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor>,std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>,std::allocator<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor>>
                    *)p_Var15,p_Var28,__args_00);
      }
      else {
        std::
        _Rb_tree<ActionDescriptor,_ActionDescriptor,_std::_Identity<ActionDescriptor>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
        ::_M_destroy_node((_Rb_tree<ActionDescriptor,_ActionDescriptor,_std::_Identity<ActionDescriptor>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
                           *)local_5c0,p_Var15);
        std::
        _Rb_tree<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor,cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor,std::_Identity<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor>,std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>,std::allocator<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor>>
        ::
        _M_construct_node<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor_const&>
                  ((_Rb_tree<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor,cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor,std::_Identity<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor>,std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>,std::allocator<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor>>
                    *)local_5c0,p_Var28,__args);
        p_Var15 = local_5c0;
      }
      std::_Rb_tree_insert_and_rebalance
                (bVar11,&p_Var15->super__Rb_tree_node_base,&p_Var24->super__Rb_tree_node_base,
                 (_Rb_tree_node_base *)local_4d0);
      local_4d0._32_8_ = local_4d0._32_8_ + 1;
      local_5c0 = local_588;
    }
    lVar27 = lVar27 + 0x48;
  } while (lVar27 != 0x1f8);
  std::
  _Rb_tree<ActionDescriptor,_ActionDescriptor,_std::_Identity<ActionDescriptor>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
  ::_M_erase((_Rb_tree<ActionDescriptor,_ActionDescriptor,_std::_Identity<ActionDescriptor>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
              *)local_560,p_Var15);
  lVar27 = 0;
  do {
    if (*(code **)((long)local_2c0 + lVar27) != (code *)0x0) {
      (**(code **)((long)local_2c0 + lVar27))(local_2e8 + lVar27 + 0x18,local_2e8 + lVar27 + 0x18,3)
      ;
    }
    if (local_2e8 + lVar27 != *(undefined1 **)((long)local_2f8 + lVar27)) {
      operator_delete(*(undefined1 **)((long)local_2f8 + lVar27),*(long *)(local_2e8 + lVar27) + 1);
    }
    lVar27 = lVar27 + -0x48;
  } while (lVar27 != -0x1f8);
  if (local_108 != (code *)0x0) {
    (*local_108)(&local_118,&local_118,3);
  }
  if (local_228 != (_Link_type)local_218) {
    operator_delete(local_228,CONCAT71(local_218._1_7_,local_218[0]) + 1);
  }
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  if (local_208 != (_Rb_tree_node_base *)local_1f8) {
    operator_delete(local_208,CONCAT71(local_1f8._1_7_,local_1f8[0]) + 1);
  }
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,3);
  }
  if (local_530 != &local_520) {
    operator_delete(local_530,CONCAT71(uStack_51f,local_520) + 1);
  }
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,3);
  }
  if (local_510 != &local_500) {
    operator_delete(local_510,CONCAT71(uStack_4ff,local_500) + 1);
  }
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,3);
  }
  if (local_1e8 != (_Rb_tree_node_base *)local_1d8) {
    operator_delete(local_1e8,CONCAT71(local_1d8._1_7_,local_1d8[0]) + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
  }
  if (local_1c8 != (_Base_ptr)local_1b8) {
    operator_delete(local_1c8,CONCAT71(local_1b8._1_7_,local_1b8[0]) + 1);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,
                    CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1);
  }
  pbVar26 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pcVar3 = pbVar26[2]._M_dataplus._M_p;
  local_168 = &local_158;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,pcVar3,pcVar3 + pbVar26[2]._M_string_length);
  local_4a8._M_unused._M_object = &local_498;
  local_498._M_allocated_capacity._6_2_ = (undefined2)((uint7)local_158._1_7_ >> 0x28);
  local_498._M_local_buf[1] = (char)local_158._M_allocated_capacity._1_7_;
  local_498._M_local_buf[2] = (char)((uint7)local_158._1_7_ >> 8);
  local_498._M_local_buf[3] = (char)((uint7)local_158._1_7_ >> 0x10);
  local_498._M_local_buf[4] = (char)((uint7)local_158._1_7_ >> 0x18);
  local_498._M_local_buf[5] = (char)((uint7)local_158._1_7_ >> 0x20);
  if (local_168 == &local_158) {
    local_498._8_3_ = (undefined3)local_158._8_8_;
    local_498._11_2_ = (undefined2)((ulong)local_158._8_8_ >> 0x18);
    local_498._13_2_ = (undefined2)((ulong)local_158._8_8_ >> 0x28);
    local_498._M_local_buf[0xf] = (char)((ulong)local_158._8_8_ >> 0x38);
  }
  else {
    local_4a8._M_unused._M_object = local_168;
  }
  local_498._M_local_buf[0] = local_158._M_local_buf[0];
  local_4a8._8_8_ = local_160;
  local_168 = &local_158;
  local_160 = 0;
  local_158._M_local_buf[0] = '\0';
  local_488 = 0;
  local_480 = (Command *)0x0;
  uStack_478 = 0;
  local_470 = (code *)0x0;
  pcStack_468 = (code *)0x0;
  p_Var15 = (_Link_type)local_4d0;
  if ((_Link_type)local_4d0._8_8_ != (_Link_type)0x0) {
    p_Var28 = (_Link_type)local_4d0._8_8_;
    do {
      if (local_4e0 == 0) goto LAB_001c202a;
      bVar10 = (*local_4d8)(&local_4f0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &p_Var28->_M_storage,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_4a8);
      if (!bVar10) {
        p_Var15 = p_Var28;
      }
      p_Var28 = *(_Link_type *)((p_Var28->_M_storage)._M_storage + (ulong)bVar10 * 8 + -0x10);
    } while (p_Var28 != (_Link_type)0x0);
  }
  p_Var28 = (_Link_type)local_4d0;
  if (p_Var15 != (_Link_type)local_4d0) {
    if (local_4e0 == 0) {
LAB_001c202a:
      std::__throw_bad_function_call();
    }
    bVar10 = (*local_4d8)(&local_4f0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_4a8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &p_Var15->_M_storage);
    p_Var28 = p_Var15;
    if (bVar10) {
      p_Var28 = (_Link_type)local_4d0;
    }
  }
  if (local_470 != (code *)0x0) {
    (*local_470)(&local_480,&local_480,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_unused._0_8_ != &local_498) {
    operator_delete(local_4a8._M_unused._M_object,
                    CONCAT26(local_498._M_allocated_capacity._6_2_,
                             CONCAT15(local_498._M_local_buf[5],
                                      CONCAT14(local_498._M_local_buf[4],
                                               CONCAT13(local_498._M_local_buf[3],
                                                        CONCAT12(local_498._M_local_buf[2],
                                                                 CONCAT11(local_498._M_local_buf[1],
                                                                          local_498._M_local_buf[0])
                                                                ))))) + 1);
  }
  if (local_168 != &local_158) {
    operator_delete(local_168,
                    CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]) + 1);
  }
  if (p_Var28 == (_Link_type)local_4d0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_4a8," sub-command TRANSFORM, ",0x18);
    pbVar26 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_4a8,pbVar26[2]._M_dataplus._M_p,
                         pbVar26[2]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," invalid action.",0x10);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_580);
  }
  else {
    if ((long)*(int *)((p_Var28->_M_storage)._M_storage + 0x20) + 3U <=
        (ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5)) {
      std::__cxx11::string::_M_assign((string *)local_2b0);
      lVar27 = (long)*(int *)((p_Var28->_M_storage)._M_storage + 0x20);
      uVar29 = lVar27 + 3;
      local_588 = p_Var28;
      if (0 < lVar27) {
        pbVar26 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_580,
                   pbVar26 + 3,pbVar26 + uVar29,(allocator_type *)&local_550);
        pbVar26 = local_270.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_4a8._8_8_ =
             local_270.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_4a8._M_unused._0_8_ =
             (undefined8)
             local_270.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_270.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_580._M_dataplus._M_p;
        local_270.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_580._M_string_length;
        local_270.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_580.field_2._M_allocated_capacity;
        local_498._M_local_buf[0] = (char)pbVar26;
        local_498._M_local_buf[1] = (char)((ulong)pbVar26 >> 8);
        local_498._M_local_buf[2] = (char)((ulong)pbVar26 >> 0x10);
        local_498._M_local_buf[3] = (char)((ulong)pbVar26 >> 0x18);
        local_498._M_local_buf[4] = (char)((ulong)pbVar26 >> 0x20);
        local_498._M_local_buf[5] = (char)((ulong)pbVar26 >> 0x28);
        local_498._M_allocated_capacity._6_2_ = (undefined2)((ulong)pbVar26 >> 0x30);
        local_580._M_dataplus._M_p = (pointer)0x0;
        local_580._M_string_length = 0;
        local_580.field_2._M_allocated_capacity = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_4a8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_580);
      }
      iVar13 = std::__cxx11::string::compare((char *)local_2b0);
      _Var17._M_head_impl = (TransformAction *)_Stack_258;
      if (iVar13 == 0) {
        _Var17._M_head_impl = (TransformAction *)operator_new(0x160);
        pbVar26 = local_270.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar4 = (this->super_cmCommand).Makefile;
        *_Var17._M_head_impl = (TransformAction)&PTR__TransformReplace_005bddf0;
        local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_580,
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_270.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 0x20))->
                   _M_allocated_capacity,
                   *(long *)((long)local_270.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 0x28) +
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_270.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 0x20))->
                   _M_allocated_capacity);
        cmStringReplaceHelper::cmStringReplaceHelper
                  ((cmStringReplaceHelper *)((long)_Var17._M_head_impl + 8),pbVar26,&local_580,
                   pcVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580._M_dataplus._M_p != &local_580.field_2) {
          operator_delete(local_580._M_dataplus._M_p,
                          (ulong)(local_580.field_2._M_allocated_capacity + 1));
        }
        cmMakefile::ClearMatches(pcVar4);
        if (((TransformAction *)((long)_Var17._M_head_impl + 0x108))->_vptr_TransformAction ==
            (_func_int **)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_4a8,
                     "sub-command TRANSFORM, action REPLACE: Failed to compile regex \"",0x40);
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_4a8,
                               *(char **)local_270.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                               *(long *)((long)local_270.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start + 8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\".",2);
          prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar23,(string *)&local_550);
          *(undefined ***)prVar23 = &PTR__runtime_error_005bde40;
          __cxa_throw(prVar23,&(anonymous_namespace)::transform_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        if (*(char *)&((TransformAction *)((long)_Var17._M_head_impl + 0x118))->
                      _vptr_TransformAction == '\0') {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_4a8,"sub-command TRANSFORM, action REPLACE: ",0x27);
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_4a8,
                               (char *)((TransformAction *)((long)_Var17._M_head_impl + 8))->
                                       _vptr_TransformAction,
                               (long)((TransformAction *)((long)_Var17._M_head_impl + 0x10))->
                                     _vptr_TransformAction);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
          prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar23,(string *)&local_550);
          *(undefined ***)prVar23 = &PTR__runtime_error_005bde40;
          __cxa_throw(prVar23,&(anonymous_namespace)::transform_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        if ((_Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
             )_Stack_258._M_head_impl != (TransformAction *)0x0) {
          TVar5._vptr_TransformAction = (_Stack_258._M_head_impl)->_vptr_TransformAction;
          _Stack_258._M_head_impl = _Var17._M_head_impl;
          (*TVar5._vptr_TransformAction[1])();
          _Var17._M_head_impl = (TransformAction *)_Stack_258;
        }
      }
      _Stack_258._M_head_impl = _Var17._M_head_impl;
      local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"REGEX","");
      local_550 = local_540;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"AT","");
      local_188 = local_178;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"FOR","");
      local_148._M_allocated_capacity = (size_type)local_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"OUTPUT_VARIABLE","");
LAB_001c10d4:
      do {
        sVar6 = local_580._M_string_length;
        pbVar26 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar25 = (long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar26 >> 5;
        if (uVar25 <= uVar29) {
          local_5a8._0_8_ = (pointer)0x0;
          local_5a8._8_8_ = (pointer)0x0;
          local_5a8._16_8_ = (pointer)0x0;
          bVar10 = GetList(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_5a8,&((Command *)local_2b0)->ListName);
          p_Var15 = local_588;
          if (bVar10) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_head_impl ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              std::make_unique<(anonymous_namespace)::TransformNoSelector>();
              _Var21._M_head_impl = local_250._M_head_impl;
              local_250._M_head_impl = (TransformSelector *)local_4a8._M_unused._0_8_;
              local_4a8._M_unused._M_object =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              if ((__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                   )_Var21._M_head_impl !=
                  (__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                   )0x0) {
                (**(code **)(*(size_type *)_Var21._M_head_impl + 8))();
              }
            }
            (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)&(local_250._M_head_impl)->_vptr_TransformSelector)->
                         _M_allocated_capacity + 0x20))
                      (local_250._M_head_impl,local_5a8,(p_Var15->_M_storage)._M_storage + 0x28);
            pcVar4 = (this->super_cmCommand).Makefile;
            cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((string *)&local_4a8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_5a8,";");
            cmMakefile::AddDefinition
                      (pcVar4,&((Command *)local_2b0)->OutputName,(char *)local_4a8._M_unused._0_8_)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._M_unused._0_8_ != &local_498) {
              operator_delete(local_4a8._M_unused._M_object,
                              CONCAT26(local_498._M_allocated_capacity._6_2_,
                                       CONCAT15(local_498._M_local_buf[5],
                                                CONCAT14(local_498._M_local_buf[4],
                                                         CONCAT13(local_498._M_local_buf[3],
                                                                  CONCAT12(local_498._M_local_buf[2]
                                                                           ,CONCAT11(local_498.
                                                                                     _M_local_buf[1]
                                                                                     ,local_498.
                                                                                      _M_local_buf
                                                                                      [0])))))) + 1)
              ;
            }
          }
          else {
            cmMakefile::AddDefinition
                      ((this->super_cmCommand).Makefile,&((Command *)local_2b0)->OutputName,"");
          }
          bVar10 = true;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_5a8);
          goto LAB_001c1ead;
        }
        lVar27 = uVar29 * 0x20;
        pbVar2 = pbVar26 + uVar29;
        __n = (pointer)pbVar26[uVar29]._M_string_length;
        if (((((__n == (pointer)local_580._M_string_length) &&
              ((__n == (pointer)0x0 ||
               (iVar13 = bcmp((pbVar2->_M_dataplus)._M_p,local_580._M_dataplus._M_p,(size_t)__n),
               iVar13 == 0)))) ||
             ((__n == local_548 &&
              ((__n == (pointer)0x0 ||
               (iVar13 = bcmp((pbVar2->_M_dataplus)._M_p,local_550,(size_t)__n), iVar13 == 0))))))
            || ((__n == local_180 &&
                ((__n == (pointer)0x0 ||
                 (iVar13 = bcmp((pbVar2->_M_dataplus)._M_p,local_188,(size_t)__n), iVar13 == 0))))))
           && ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_250._M_head_impl !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_4a8,"sub-command TRANSFORM, selector already specified (",
                     0x33);
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_4a8,*(char **)((long)local_250._M_head_impl + 8),
                               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)((long)local_250._M_head_impl + 0x10))->_M_allocated_capacity);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)local_5a8);
LAB_001c1e10:
          if ((pointer)local_5a8._0_8_ != (pointer)(local_5a8 + 0x10)) {
LAB_001c1e1e:
            operator_delete((void *)local_5a8._0_8_,(ulong)(local_5a8._16_8_ + 1));
          }
LAB_001c1e2b:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4a8);
          std::ios_base::~ios_base((ios_base *)&local_438);
          goto LAB_001c1eab;
        }
        if ((__n != (pointer)sVar6) ||
           ((__n != (pointer)0x0 &&
            (iVar13 = bcmp((pbVar2->_M_dataplus)._M_p,local_580._M_dataplus._M_p,(size_t)__n),
            iVar13 != 0)))) {
          if ((__n == local_548) &&
             ((__n == (pointer)0x0 ||
              (iVar13 = bcmp((pbVar2->_M_dataplus)._M_p,local_550,(size_t)__n), iVar13 == 0)))) {
            local_5a8._0_8_ = (pointer)0x0;
            local_5a8._8_8_ = (pointer)0x0;
            local_5a8._16_8_ = (pointer)0x0;
            pbVar26 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar29 = uVar29 + 1;
            if (uVar29 < (ulong)((long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar26
                                >> 5)) {
              piVar19 = __errno_location();
              do {
                paVar7 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           **)((long)&pbVar26[1]._M_dataplus._M_p + lVar27);
                iVar13 = *piVar19;
                *piVar19 = 0;
                lVar18 = strtol(paVar7->_M_local_buf,(char **)&local_4a8,10);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4a8._M_unused._0_8_ == paVar7) {
                  uVar22 = std::__throw_invalid_argument("stoi");
                  goto LAB_001c217b;
                }
                if ((lVar18 - 0x80000000U < 0xffffffff00000000) || (*piVar19 == 0x22)) {
                  uVar22 = std::__throw_out_of_range("stoi");
                  goto LAB_001c217b;
                }
                if (*piVar19 == 0) {
                  *piVar19 = iVar13;
                }
                local_128.Begin._M_current._0_4_ = (int)lVar18;
                if ((long)local_4a8._M_unused._0_8_ - (long)paVar7 !=
                    *(long *)((long)&(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[1]._M_string_length
                             + lVar27)) break;
                if (local_5a8._8_8_ == local_5a8._16_8_) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)local_5a8,(iterator)local_5a8._8_8_,
                             (int *)&local_128);
                }
                else {
                  *(int *)local_5a8._8_8_ = (int)lVar18;
                  local_5a8._8_8_ = local_5a8._8_8_ + 4;
                }
                pbVar26 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                uVar29 = uVar29 + 1;
                lVar27 = lVar27 + 0x20;
              } while (uVar29 < (ulong)((long)(args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)pbVar26 >> 5));
            }
            uVar9 = local_5a8._8_8_;
            uVar22 = local_5a8._0_8_;
            if (local_5a8._0_8_ == local_5a8._8_8_) {
              local_4a8._M_unused._M_object = &local_498;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_4a8,
                         "sub-command TRANSFORM, selector AT expects at least one numeric value.",""
                        );
              cmCommand::SetError(&this->super_cmCommand,(string *)&local_4a8);
              _Var21._M_head_impl = local_250._M_head_impl;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_unused._0_8_ != &local_498) {
                operator_delete(local_4a8._M_unused._M_object,
                                CONCAT26(local_498._M_allocated_capacity._6_2_,
                                         CONCAT15(local_498._M_local_buf[5],
                                                  CONCAT14(local_498._M_local_buf[4],
                                                           CONCAT13(local_498._M_local_buf[3],
                                                                    CONCAT12(local_498._M_local_buf
                                                                             [2],CONCAT11(local_498.
                                                                                                                                                                                    
                                                  _M_local_buf[1],local_498._M_local_buf[0])))))) +
                                1);
                _Var21._M_head_impl = local_250._M_head_impl;
              }
            }
            else {
              _Var21._M_head_impl = (TransformSelector *)operator_new(0x40);
              local_498._M_local_buf[1] = 'T';
              local_498._M_local_buf[2] = '\0';
              *(undefined ***)_Var21._M_head_impl = &PTR__TransformSelector_005bdec8;
              *(long **)((long)_Var21._M_head_impl + 8) = (long *)((long)_Var21._M_head_impl + 0x18)
              ;
              *(long *)((long)_Var21._M_head_impl + 0x18) =
                   CONCAT26(local_498._M_allocated_capacity._6_2_,
                            CONCAT15(local_498._M_local_buf[5],
                                     CONCAT14(local_498._M_local_buf[4],
                                              CONCAT13(local_498._M_local_buf[3],0x5441))));
              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)_Var21._M_head_impl + 0x20))->_M_allocated_capacity =
                   CONCAT17(local_498._M_local_buf[0xf],
                            CONCAT25(local_498._13_2_,CONCAT23(local_498._11_2_,local_498._8_3_)));
              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)_Var21._M_head_impl + 0x10))->_M_allocated_capacity = 2;
              local_4a8._8_8_ = 0;
              local_498._M_local_buf[0] = '\0';
              *(undefined ***)_Var21._M_head_impl = &PTR__TransformSelectorIndexes_005bdf68;
              local_4a8._M_unused._M_object = &local_498;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)((long)_Var21._M_head_impl + 0x28),
                         (vector<int,_std::allocator<int>_> *)local_5a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_unused._0_8_ != &local_498) {
                operator_delete(local_4a8._M_unused._M_object,
                                CONCAT26(local_498._M_allocated_capacity._6_2_,
                                         CONCAT15(local_498._M_local_buf[5],
                                                  CONCAT14(local_498._M_local_buf[4],
                                                           CONCAT13(local_498._M_local_buf[3],
                                                                    CONCAT12(local_498._M_local_buf
                                                                             [2],CONCAT11(local_498.
                                                                                                                                                                                    
                                                  _M_local_buf[1],local_498._M_local_buf[0])))))) +
                                1);
              }
              *(undefined ***)_Var21._M_head_impl = &PTR__TransformSelectorIndexes_005bdf00;
              if ((_Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                   )local_250._M_head_impl != (TransformSelector *)0x0) {
                sVar6 = *(size_type *)local_250._M_head_impl;
                local_250._M_head_impl = _Var21._M_head_impl;
                (**(code **)(sVar6 + 8))();
                _Var21._M_head_impl = local_250._M_head_impl;
              }
            }
            local_250._M_head_impl = _Var21._M_head_impl;
            if ((pointer)local_5a8._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_5a8._0_8_,local_5a8._16_8_ - local_5a8._0_8_);
            }
            if (uVar22 == uVar9) goto LAB_001c1eab;
          }
          else {
            if ((__n != local_180) ||
               ((__n != (pointer)0x0 &&
                (iVar13 = bcmp((pbVar2->_M_dataplus)._M_p,local_188,(size_t)__n), iVar13 != 0)))) {
              if ((__n == (pointer)local_148._8_8_) &&
                 ((__n == (pointer)0x0 ||
                  (iVar13 = bcmp((pbVar2->_M_dataplus)._M_p,(void *)local_148._M_allocated_capacity,
                                 (size_t)__n), iVar13 == 0)))) {
                if (uVar25 != uVar29 + 1) {
                  std::__cxx11::string::_M_assign((string *)&((Command *)local_2b0)->OutputName);
                  goto LAB_001c136e;
                }
                local_4a8._M_unused._M_object = &local_498;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_4a8,
                           "sub-command TRANSFORM, OUTPUT_VARIABLE expects variable name argument.",
                           "");
                cmCommand::SetError(&this->super_cmCommand,(string *)&local_4a8);
                goto LAB_001c1e86;
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_4a8,"sub-command TRANSFORM, \'",0x18);
              local_128.Begin._M_current =
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar29;
              local_128.End._M_current =
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                        ((string *)local_5a8,&local_128," ");
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_4a8,(char *)local_5a8._0_8_,local_5a8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16,"\': unexpected argument(s).",0x1a);
              if ((pointer)local_5a8._0_8_ != (pointer)(local_5a8 + 0x10)) {
                operator_delete((void *)local_5a8._0_8_,(ulong)(local_5a8._16_8_ + 1));
              }
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(&this->super_cmCommand,(string *)local_5a8);
              if ((pointer)local_5a8._0_8_ != (pointer)(local_5a8 + 0x10)) goto LAB_001c1e1e;
              goto LAB_001c1e2b;
            }
            uVar1 = uVar29 + 2;
            if (uVar25 <= uVar1) {
              local_4a8._M_unused._M_object = &local_498;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_4a8,
                         "sub-command TRANSFORM, selector FOR expects, at least, two arguments.","")
              ;
              cmCommand::SetError(&this->super_cmCommand,(string *)&local_4a8);
LAB_001c1e86:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_unused._0_8_ != &local_498) {
                operator_delete(local_4a8._M_unused._M_object,
                                CONCAT26(local_498._M_allocated_capacity._6_2_,
                                         CONCAT15(local_498._M_local_buf[5],
                                                  CONCAT14(local_498._M_local_buf[4],
                                                           CONCAT13(local_498._M_local_buf[3],
                                                                    CONCAT12(local_498._M_local_buf
                                                                             [2],CONCAT11(local_498.
                                                                                                                                                                                    
                                                  _M_local_buf[1],local_498._M_local_buf[0])))))) +
                                1);
              }
              goto LAB_001c1eab;
            }
            uVar25 = uVar29 + 1;
            paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)pbVar26[uVar25]._M_dataplus._M_p;
            piVar19 = __errno_location();
            iVar13 = *piVar19;
            *piVar19 = 0;
            p_Var20 = (_Base_ptr)strtol(paVar7->_M_local_buf,(char **)&local_4a8,10);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._M_unused._0_8_ == paVar7) {
              uVar22 = std::__throw_invalid_argument("stoi");
LAB_001c217b:
              if ((pointer)local_5a8._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_5a8._0_8_,local_5a8._16_8_ - local_5a8._0_8_);
              }
              if ((long *)local_148._M_allocated_capacity != local_138) {
                operator_delete((void *)local_148._M_allocated_capacity,local_138[0] + 1);
              }
              if (local_188 != local_178) {
                operator_delete(local_188,local_178[0] + 1);
              }
              if (local_550 != local_540) {
                operator_delete(local_550,local_540[0] + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_580._M_dataplus._M_p != &local_580.field_2) {
                operator_delete(local_580._M_dataplus._M_p,
                                (ulong)(local_580.field_2._M_allocated_capacity + 1));
              }
              std::
              set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
              ::~set((set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
                      *)&local_4f0);
              HandleTransformCommand::Command::~Command((Command *)local_2b0);
              _Unwind_Resume(uVar22);
            }
            local_560 = p_Var20;
            if ((p_Var20 + -0x4000000 < (_Base_ptr)0xffffffff00000000) || (*piVar19 == 0x22)) {
              uVar22 = std::__throw_out_of_range("stoi");
              goto LAB_001c217b;
            }
            if (*piVar19 == 0) {
              *piVar19 = iVar13;
            }
            pbVar26 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_5c0 = (_Link_type)0x0;
            if ((long)local_4a8._M_unused._0_8_ - (long)paVar7 == pbVar26[uVar25]._M_string_length)
            {
              paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)pbVar26[uVar1]._M_dataplus._M_p;
              iVar13 = *piVar19;
              *piVar19 = 0;
              local_5c0 = (_Link_type)strtol(paVar7->_M_local_buf,(char **)&local_4a8,10);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_unused._0_8_ == paVar7) {
                uVar22 = std::__throw_invalid_argument("stoi");
                goto LAB_001c217b;
              }
              if (((long)local_5c0 - 0x80000000U < 0xffffffff00000000) || (*piVar19 == 0x22)) {
                uVar22 = std::__throw_out_of_range("stoi");
                goto LAB_001c217b;
              }
              if (*piVar19 == 0) {
                *piVar19 = iVar13;
              }
              bVar10 = (long)local_4a8._M_unused._0_8_ - (long)paVar7 ==
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[uVar1]._M_string_length;
              uVar25 = uVar1;
            }
            else {
              bVar10 = false;
            }
            if (bVar10) {
              pbVar26 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              uVar1 = uVar25 + 1;
              iVar13 = 1;
              uVar29 = uVar1;
              if (uVar1 < (ulong)((long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar26
                                 >> 5)) {
                paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)pbVar26[uVar1]._M_dataplus._M_p;
                local_554 = *piVar19;
                *piVar19 = 0;
                lVar27 = strtol(paVar7->_M_local_buf,(char **)&local_4a8,10);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4a8._M_unused._0_8_ == paVar7) {
                  uVar22 = std::__throw_invalid_argument("stoi");
                  goto LAB_001c217b;
                }
                if ((lVar27 - 0x80000000U < 0xffffffff00000000) || (*piVar19 == 0x22)) {
                  uVar22 = std::__throw_out_of_range("stoi");
                  goto LAB_001c217b;
                }
                if (*piVar19 == 0) {
                  *piVar19 = local_554;
                }
                uVar29 = uVar25 + 2;
                iVar13 = (int)lVar27;
                if ((long)local_4a8._M_unused._0_8_ - (long)paVar7 !=
                    (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar1]._M_string_length) {
                  iVar13 = 1;
                  uVar29 = uVar1;
                }
              }
              if (iVar13 < 0) {
                local_4a8._M_unused._M_object = &local_498;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_4a8,
                           "sub-command TRANSFORM, selector FOR expects non negative numeric value for <step>."
                           ,"");
                cmCommand::SetError(&this->super_cmCommand,(string *)&local_4a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4a8._M_unused._0_8_ != &local_498) {
                  operator_delete(local_4a8._M_unused._M_object,
                                  CONCAT26(local_498._M_allocated_capacity._6_2_,
                                           CONCAT15(local_498._M_local_buf[5],
                                                    CONCAT14(local_498._M_local_buf[4],
                                                             CONCAT13(local_498._M_local_buf[3],
                                                                      CONCAT12(local_498.
                                                                               _M_local_buf[2],
                                                                               CONCAT11(local_498.
                                                                                        _M_local_buf
                                                                                        [1],
                                                  local_498._M_local_buf[0])))))) + 1);
                }
              }
              _Var21._M_head_impl = (TransformSelector *)operator_new(0x50);
              local_4a8._M_unused._M_object = &local_498;
              local_498._M_local_buf[2] = 'R';
              local_498._M_local_buf[1] = 'O';
              local_498._M_local_buf[3] = '\0';
              *(undefined ***)_Var21._M_head_impl = &PTR__TransformSelector_005bdec8;
              *(long **)((long)_Var21._M_head_impl + 8) = (long *)((long)_Var21._M_head_impl + 0x18)
              ;
              *(undefined2 *)((long)_Var21._M_head_impl + 0x18) = 0x4f46;
              *(char *)((long)_Var21._M_head_impl + 0x1a) = 'R';
              *(ulong *)((long)_Var21._M_head_impl + 0x1b) =
                   (ulong)CONCAT34(local_498._8_3_,
                                   CONCAT22(local_498._M_allocated_capacity._6_2_,
                                            CONCAT11(local_498._M_local_buf[5],
                                                     local_498._M_local_buf[4]))) << 8;
              *(uint *)((long)_Var21._M_head_impl + 0x23) =
                   CONCAT22(local_498._13_2_,local_498._11_2_);
              *(char *)((long)_Var21._M_head_impl + 0x27) = local_498._M_local_buf[0xf];
              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)_Var21._M_head_impl + 0x10))->_M_allocated_capacity = 3;
              local_4a8._8_8_ = 0;
              local_498._M_local_buf[0] = '\0';
              *(undefined ***)_Var21._M_head_impl = &PTR__TransformSelectorIndexes_005bdf68;
              *(long *)((long)_Var21._M_head_impl + 0x28) = 0;
              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)_Var21._M_head_impl + 0x30))->_M_allocated_capacity = 0;
              *(long *)((long)_Var21._M_head_impl + 0x38) = 0;
              *(undefined ***)_Var21._M_head_impl = &PTR__TransformSelectorIndexes_005bdfa0;
              *(int *)((long)_Var21._M_head_impl + 0x40) = (int)local_560;
              *(int *)((long)_Var21._M_head_impl + 0x44) = (int)local_5c0;
              *(int *)((long)_Var21._M_head_impl + 0x48) = iVar13;
              if ((_Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>)
                  local_250._M_head_impl !=
                  (_Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>)0x0) {
                paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)&(local_250._M_head_impl)->_vptr_TransformSelector;
                local_250._M_head_impl = _Var21._M_head_impl;
                (**(code **)(paVar7->_M_allocated_capacity + 8))();
                _Var21._M_head_impl = local_250._M_head_impl;
              }
            }
            else {
              local_4a8._M_unused._M_object = &local_498;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_4a8,
                         "sub-command TRANSFORM, selector FOR expects, at least, two numeric values."
                         ,"");
              cmCommand::SetError(&this->super_cmCommand,(string *)&local_4a8);
              uVar29 = uVar25;
              _Var21._M_head_impl = local_250._M_head_impl;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_unused._0_8_ != &local_498) {
                operator_delete(local_4a8._M_unused._M_object,
                                CONCAT26(local_498._M_allocated_capacity._6_2_,
                                         CONCAT15(local_498._M_local_buf[5],
                                                  CONCAT14(local_498._M_local_buf[4],
                                                           CONCAT13(local_498._M_local_buf[3],
                                                                    CONCAT12(local_498._M_local_buf
                                                                             [2],CONCAT11(local_498.
                                                                                                                                                                                    
                                                  _M_local_buf[1],local_498._M_local_buf[0])))))) +
                                1);
                _Var21._M_head_impl = local_250._M_head_impl;
              }
            }
            local_250._M_head_impl = _Var21._M_head_impl;
            if (!bVar10) goto LAB_001c1eab;
          }
          goto LAB_001c10d4;
        }
        uVar1 = uVar29 + 1;
        if (uVar25 == uVar1) {
          local_4a8._M_unused._M_object = &local_498;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_4a8,
                     "sub-command TRANSFORM, selector REGEX expects \'regular expression\' argument."
                     ,"");
          cmCommand::SetError(&this->super_cmCommand,(string *)&local_4a8);
          goto LAB_001c1e86;
        }
        _Var21._M_head_impl = (TransformSelector *)operator_new(0xf8);
        local_4a8._M_unused._M_object = &local_498;
        local_498._M_local_buf[4] = 'X';
        local_498._M_local_buf[0] = 'R';
        local_498._M_local_buf[1] = 'E';
        local_498._M_local_buf[2] = 'G';
        local_498._M_local_buf[3] = 'E';
        local_4a8._8_8_ = 5;
        local_498._M_local_buf[5] = '\0';
        *(undefined ***)_Var21._M_head_impl = &PTR__TransformSelector_005bdec8;
        *(long **)((long)_Var21._M_head_impl + 8) = (long *)((long)_Var21._M_head_impl + 0x18);
        *(undefined4 *)((long)_Var21._M_head_impl + 0x18) = 0x45474552;
        *(char *)((long)_Var21._M_head_impl + 0x1c) = 'X';
        *(ulong *)((long)_Var21._M_head_impl + 0x1d) =
             (ulong)CONCAT25(local_498._11_2_,
                             CONCAT32(local_498._8_3_,local_498._M_allocated_capacity._6_2_)) << 8;
        *(undefined2 *)((long)_Var21._M_head_impl + 0x25) = local_498._13_2_;
        *(char *)((long)_Var21._M_head_impl + 0x27) = local_498._M_local_buf[0xf];
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)((long)_Var21._M_head_impl + 0x10))->_M_allocated_capacity = 5;
        *(undefined ***)_Var21._M_head_impl = &PTR__TransformSelectorRegex_005bde68;
        *(long *)((long)_Var21._M_head_impl + 0x28) = 0;
        *(long *)((long)_Var21._M_head_impl + 0x78) = 0;
        *(long *)((long)_Var21._M_head_impl + 200) = 0;
        *(long *)((long)_Var21._M_head_impl + 0xe8) = 0;
        cmsys::RegularExpression::compile
                  ((RegularExpression *)((long)_Var21._M_head_impl + 0x28),
                   pbVar26[uVar1]._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_head_impl !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)&(local_250._M_head_impl)->_vptr_TransformSelector;
          local_250._M_head_impl = _Var21._M_head_impl;
          (**(code **)(paVar7->_M_allocated_capacity + 8))();
          _Var21._M_head_impl = local_250._M_head_impl;
        }
        local_250._M_head_impl = _Var21._M_head_impl;
        cVar12 = (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)&(local_250._M_head_impl)->_vptr_TransformSelector)->
                              _M_allocated_capacity + 0x10))(local_250._M_head_impl,0);
        if (cVar12 == '\0') {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_4a8,
                     "sub-command TRANSFORM, selector REGEX failed to compile regex \"",0x3f);
          pbVar26 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_4a8,pbVar26[uVar1]._M_dataplus._M_p,
                               pbVar26[uVar1]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\".",2);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)local_5a8);
          goto LAB_001c1e10;
        }
LAB_001c136e:
        uVar29 = uVar29 + 2;
      } while( true );
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_4a8,"sub-command TRANSFORM, action ",0x1e);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_4a8,*(char **)(p_Var28->_M_storage)._M_storage,
                         *(long *)((p_Var28->_M_storage)._M_storage + 8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," expects ",9);
    poVar16 = (ostream *)
              std::ostream::operator<<(poVar16,*(int *)((p_Var28->_M_storage)._M_storage + 0x20));
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," argument(s).",0xd);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_580);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p,(ulong)(local_580.field_2._M_allocated_capacity + 1))
    ;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4a8);
  std::ios_base::~ios_base((ios_base *)&local_438);
  bVar10 = false;
LAB_001c1f35:
  std::
  set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
  ::~set((set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
          *)&local_4f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &(((Command *)local_2b0)->OutputName).field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((_Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>)local_250._M_head_impl !=
      (_Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>)0x0) {
    (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&(local_250._M_head_impl)->_vptr_TransformSelector)->_M_allocated_capacity + 8)
    )();
  }
  local_250._M_head_impl = (TransformSelector *)0x0;
  if ((_Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
       )_Stack_258._M_head_impl != (TransformAction *)0x0) {
    (*(_Stack_258._M_head_impl)->_vptr_TransformAction[1])();
  }
  _Stack_258._M_head_impl = (TransformAction *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&((Command *)local_2b0)->Arguments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &(((Command *)local_2b0)->ListName).field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._0_8_ != &(((Command *)local_2b0)->Name).field_2) {
    operator_delete((void *)local_2b0._0_8_,CONCAT71(local_2b0._17_7_,local_2b0[0x10]) + 1);
  }
  return bVar10;
LAB_001c1eab:
  bVar10 = false;
LAB_001c1ead:
  if ((long *)local_148._M_allocated_capacity != local_138) {
    operator_delete((void *)local_148._M_allocated_capacity,local_138[0] + 1);
  }
  if (local_188 != local_178) {
    operator_delete(local_188,local_178[0] + 1);
  }
  if (local_550 != local_540) {
    operator_delete(local_550,local_540[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p,(ulong)(local_580.field_2._M_allocated_capacity + 1))
    ;
  }
  goto LAB_001c1f35;
}

Assistant:

bool cmListCommand::HandleTransformCommand(
  std::vector<std::string> const& args)
{
  if (args.size() < 3) {
    this->SetError(
      "sub-command TRANSFORM requires an action to be specified.");
    return false;
  }

  // Structure collecting all elements of the command
  struct Command
  {
    Command(const std::string& listName)
      : ListName(listName)
      , OutputName(listName)
    {
    }

    std::string Name;
    std::string ListName;
    std::vector<std::string> Arguments;
    std::unique_ptr<TransformAction> Action;
    std::unique_ptr<TransformSelector> Selector;
    std::string OutputName;
  } command(args[1]);

  // Descriptor of action
  // Arity: number of arguments required for the action
  // Transform: lambda function implementing the action
  struct ActionDescriptor
  {
    ActionDescriptor(std::string name)
      : Name(std::move(name))
    {
    }
    ActionDescriptor(std::string name, int arity, transform_type transform)
      : Name(std::move(name))
      , Arity(arity)
#if defined(__GNUC__) && __GNUC__ == 6 && defined(__aarch64__)
      // std::function move constructor miscompiles on this architecture
      , Transform(transform)
#else
      , Transform(std::move(transform))
#endif
    {
    }

    operator const std::string&() const { return Name; }

    std::string Name;
    int Arity = 0;
    transform_type Transform;
  };

  // Build a set of supported actions.
  std::set<ActionDescriptor,
           std::function<bool(const std::string&, const std::string&)>>
    descriptors(
      [](const std::string& x, const std::string& y) { return x < y; });
  descriptors = { { "APPEND", 1,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return s + command.Arguments[0];
                      }

                      return s;
                    } },
                  { "PREPEND", 1,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return command.Arguments[0] + s;
                      }

                      return s;
                    } },
                  { "TOUPPER", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmSystemTools::UpperCase(s);
                      }

                      return s;
                    } },
                  { "TOLOWER", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmSystemTools::LowerCase(s);
                      }

                      return s;
                    } },
                  { "STRIP", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmSystemTools::TrimWhitespace(s);
                      }

                      return s;
                    } },
                  { "GENEX_STRIP", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmGeneratorExpression::Preprocess(
                          s,
                          cmGeneratorExpression::StripAllGeneratorExpressions);
                      }

                      return s;
                    } },
                  { "REPLACE", 2,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return command.Action->Transform(s);
                      }

                      return s;
                    } } };

  using size_type = std::vector<std::string>::size_type;
  size_type index = 2;

  // Parse all possible function parameters
  auto descriptor = descriptors.find(args[index]);

  if (descriptor == descriptors.end()) {
    std::ostringstream error;
    error << " sub-command TRANSFORM, " << args[index] << " invalid action.";
    this->SetError(error.str());
    return false;
  }

  // Action arguments
  index += 1;
  if (args.size() < index + descriptor->Arity) {
    std::ostringstream error;
    error << "sub-command TRANSFORM, action " << descriptor->Name
          << " expects " << descriptor->Arity << " argument(s).";
    this->SetError(error.str());
    return false;
  }

  command.Name = descriptor->Name;
  index += descriptor->Arity;
  if (descriptor->Arity > 0) {
    command.Arguments =
      std::vector<std::string>(args.begin() + 3, args.begin() + index);
  }

  if (command.Name == "REPLACE") {
    try {
      command.Action =
        cm::make_unique<TransformReplace>(command.Arguments, this->Makefile);
    } catch (const transform_error& e) {
      this->SetError(e.what());
      return false;
    }
  }

  const std::string REGEX{ "REGEX" }, AT{ "AT" }, FOR{ "FOR" },
    OUTPUT_VARIABLE{ "OUTPUT_VARIABLE" };

  // handle optional arguments
  while (args.size() > index) {
    if ((args[index] == REGEX || args[index] == AT || args[index] == FOR) &&
        command.Selector) {
      std::ostringstream error;
      error << "sub-command TRANSFORM, selector already specified ("
            << command.Selector->Tag << ").";
      this->SetError(error.str());
      return false;
    }

    // REGEX selector
    if (args[index] == REGEX) {
      if (args.size() == ++index) {
        this->SetError("sub-command TRANSFORM, selector REGEX expects "
                       "'regular expression' argument.");
        return false;
      }

      command.Selector = cm::make_unique<TransformSelectorRegex>(args[index]);
      if (!command.Selector->Validate()) {
        std::ostringstream error;
        error << "sub-command TRANSFORM, selector REGEX failed to compile "
                 "regex \"";
        error << args[index] << "\".";
        this->SetError(error.str());
        return false;
      }

      index += 1;
      continue;
    }

    // AT selector
    if (args[index] == AT) {
      // get all specified indexes
      std::vector<int> indexes;
      while (args.size() > ++index) {
        std::size_t pos;
        int value;

        try {
          value = std::stoi(args[index], &pos);
          if (pos != args[index].length()) {
            // this is not a number, stop processing
            break;
          }
          indexes.push_back(value);
        } catch (const std::invalid_argument&) {
          // this is not a number, stop processing
          break;
        }
      }

      if (indexes.empty()) {
        this->SetError(
          "sub-command TRANSFORM, selector AT expects at least one "
          "numeric value.");
        return false;
      }

      command.Selector =
        cm::make_unique<TransformSelectorAt>(std::move(indexes));

      continue;
    }

    // FOR selector
    if (args[index] == FOR) {
      if (args.size() <= ++index + 1) {
        this->SetError("sub-command TRANSFORM, selector FOR expects, at least,"
                       " two arguments.");
        return false;
      }

      int start = 0, stop = 0, step = 1;
      bool valid = true;
      try {
        std::size_t pos;

        start = std::stoi(args[index], &pos);
        if (pos != args[index].length()) {
          // this is not a number
          valid = false;
        } else {
          stop = std::stoi(args[++index], &pos);
          if (pos != args[index].length()) {
            // this is not a number
            valid = false;
          }
        }
      } catch (const std::invalid_argument&) {
        // this is not numbers
        valid = false;
      }
      if (!valid) {
        this->SetError("sub-command TRANSFORM, selector FOR expects, "
                       "at least, two numeric values.");
        return false;
      }
      // try to read a third numeric value for step
      if (args.size() > ++index) {
        try {
          std::size_t pos;

          step = std::stoi(args[index], &pos);
          if (pos != args[index].length()) {
            // this is not a number
            step = 1;
          } else {
            index += 1;
          }
        } catch (const std::invalid_argument&) {
          // this is not number, ignore exception
        }
      }

      if (step < 0) {
        this->SetError("sub-command TRANSFORM, selector FOR expects "
                       "non negative numeric value for <step>.");
      }

      command.Selector =
        cm::make_unique<TransformSelectorFor>(start, stop, step);

      continue;
    }

    // output variable
    if (args[index] == OUTPUT_VARIABLE) {
      if (args.size() == ++index) {
        this->SetError("sub-command TRANSFORM, OUTPUT_VARIABLE "
                       "expects variable name argument.");
        return false;
      }

      command.OutputName = args[index++];
      continue;
    }

    std::ostringstream error;
    error << "sub-command TRANSFORM, '"
          << cmJoin(cmMakeRange(args).advance(index), " ")
          << "': unexpected argument(s).";
    this->SetError(error.str());
    return false;
  }

  // expand the list variable
  std::vector<std::string> varArgsExpanded;
  if (!this->GetList(varArgsExpanded, command.ListName)) {
    this->Makefile->AddDefinition(command.OutputName, "");
    return true;
  }

  if (!command.Selector) {
    // no selector specified, apply transformation to all elements
    command.Selector = cm::make_unique<TransformNoSelector>();
  }

  try {
    command.Selector->Transform(varArgsExpanded, descriptor->Transform);
  } catch (const transform_error& e) {
    this->SetError(e.what());
    return false;
  }

  this->Makefile->AddDefinition(command.OutputName,
                                cmJoin(varArgsExpanded, ";").c_str());

  return true;
}